

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_seq_flow(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  long lVar10;
  bool bVar11;
  undefined1 uVar12;
  int iVar13;
  size_t sVar14;
  State *pSVar15;
  uint uVar16;
  char c;
  char *pcVar17;
  long lVar18;
  csubstr fmt;
  bool is_quoted;
  char msg [31];
  bool local_179;
  csubstr local_178;
  char local_168 [64];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  char *pcStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  char *pcStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  char *pcStack_20;
  undefined8 local_18;
  
  local_178 = (this->m_state->line_contents).rem;
  if ((this->m_state->flags & 0x40) != 0) {
    builtin_strncpy(local_168,"check failed: (has_none(RKEY))",0x1f);
    if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar1 = (code *)swi(3);
      uVar12 = (*pcVar1)();
      return (bool)uVar12;
    }
    local_38 = 0;
    uStack_30 = 0x6d80;
    local_28 = 0;
    pcStack_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_18 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6d80) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x6d80) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_168,0x1f,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((~this->m_state->flags & 0x18U) != 0) {
    builtin_strncpy(local_168,"check failed: (has_all(RSEQ|FLOW))",0x23);
    if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      pcVar1 = (code *)swi(3);
      uVar12 = (*pcVar1)();
      return (bool)uVar12;
    }
    local_60 = 0;
    uStack_58 = 0x6d81;
    local_50 = 0;
    pcStack_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_40 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6d81) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6d81) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_168,0x23,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  sVar14 = local_178.len;
  if (local_178.len != 0) {
    if (*local_178.str != ' ') {
      if (local_178.len != 0) {
        if (*local_178.str == '#') {
          _scan_comment(this);
          return true;
        }
        if ((local_178.len != 0) && (*local_178.str == ']')) {
          _pop_level(this);
          _line_progressed(this,1);
          if ((this->m_state->flags & 0x2000) == 0) {
            return true;
          }
          _stop_seqimap(this);
          _pop_level(this);
          return true;
        }
      }
      goto LAB_001cdb2d;
    }
    if (((this->m_state->line_contents).rem.len == 0) ||
       (*(this->m_state->line_contents).rem.str != ' ')) {
      builtin_strncpy(local_168 + 0x23,"ts.rem.begins_with(c))",0x17);
      builtin_strncpy(local_168,"check failed: (m_state->line_conten",0x23);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar12 = (*pcVar1)();
        return (bool)uVar12;
      }
      local_128 = 0;
      uStack_120 = 0x6d66;
      local_118 = 0;
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_168,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    pSVar15 = this->m_state;
    c = ' ';
LAB_001cda97:
    sVar14 = basic_substring<const_char>::first_not_of(&(pSVar15->line_contents).rem,c,0);
    if (sVar14 == 0xffffffffffffffff) {
      sVar14 = (this->m_state->line_contents).rem.len;
    }
    goto LAB_001cdff7;
  }
LAB_001cdb2d:
  uVar16 = this->m_state->flags;
  if ((char)uVar16 < '\0') {
    if ((uVar16 >> 8 & 1) != 0) {
      builtin_strncpy(local_168,"check failed: (has_none(RNXT))",0x1f);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar12 = (*pcVar1)();
        return (bool)uVar12;
      }
      local_88 = 0;
      uStack_80 = 0x6da5;
      local_78 = 0;
      pcStack_70 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_68 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6da5) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x6da5) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_168,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar11 = _scan_scalar_seq_flow(this,&local_178,&local_179);
    if (bVar11) {
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _append_val(this,local_178,(uint)local_179);
      return true;
    }
    sVar14 = local_178.len;
    if (local_178.len == 0) {
LAB_001cdf8a:
      iVar13 = basic_substring<const_char>::compare(&local_178,':');
      if (iVar13 != 0) {
        if (sVar14 < 2) {
LAB_001ce15f:
          bVar11 = _handle_types(this);
          if (bVar11) {
            return true;
          }
          bVar11 = _handle_val_anchors_and_refs(this);
          if (bVar11) {
            return true;
          }
          if ((1 < local_178.len) && (*local_178.str == ',')) {
            lVar10 = 0;
            do {
              lVar18 = lVar10;
              if (lVar18 == 1) break;
              lVar10 = lVar18 + 1;
            } while (local_178.str[lVar18 + 1] == " not within [0, "[lVar18 + 0xf]);
            if (lVar18 != 0) {
              _append_val_null(this,local_178.str + -1);
              goto LAB_001cdfe0;
            }
          }
          if (local_178.len != 0) {
            if (*local_178.str == ',') {
              _append_val_null(this,local_178.str + -1);
              goto LAB_001cdfef;
            }
            if ((local_178.len != 0) && (*local_178.str == '\t')) {
              if (((this->m_state->line_contents).rem.len == 0) ||
                 (*(this->m_state->line_contents).rem.str != '\t')) {
                builtin_strncpy(local_168 + 0x23,"ts.rem.begins_with(c))",0x17);
                builtin_strncpy(local_168,"check failed: (m_state->line_conten",0x23);
                if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                  pcVar1 = (code *)swi(3);
                  uVar12 = (*pcVar1)();
                  return (bool)uVar12;
                }
                local_128 = 0;
                uStack_120 = 0x6d66;
                local_118 = 0;
                pcStack_110 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_108 = 0x65;
                LVar9.super_LineCol.col = 0;
                LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
                LVar9.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
                LVar9.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar9.name.len = 0x65;
                (*(this->m_stack).m_callbacks.m_error)
                          (local_168,0x3a,LVar9,(this->m_stack).m_callbacks.m_user_data);
              }
              pSVar15 = this->m_state;
              c = '\t';
              goto LAB_001cda97;
            }
          }
          bVar11 = is_debugger_attached();
          if ((bVar11) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar1 = (code *)swi(3);
            uVar12 = (*pcVar1)();
            return (bool)uVar12;
          }
          pcVar17 = "ERROR: parse error";
          sVar14 = 0x12;
          goto LAB_001cdf29;
        }
        if (*local_178.str != ':') {
LAB_001ce009:
          if ((1 < sVar14) && (*local_178.str == '?')) {
            lVar10 = 0;
            do {
              lVar18 = lVar10;
              if (lVar18 == 1) break;
              lVar10 = lVar18 + 1;
            } while (local_178.str[lVar18 + 1] == "? "[lVar18 + 1]);
            if (lVar18 != 0) {
              _start_seqimap(this);
              _line_progressed(this,2);
              if (((this->m_state->flags & 0x200) == 0) ||
                 (iVar13 = basic_substring<const_char>::compare(&this->m_state->scalar,"",0),
                 iVar13 != 0)) {
                builtin_strncpy(local_168,"check failed: (has_any(SSCL) && m_state->scalar == \"\")"
                                ,0x37);
                if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                  pcVar1 = (code *)swi(3);
                  uVar12 = (*pcVar1)();
                  return (bool)uVar12;
                }
                local_b0 = 0;
                uStack_a8 = 0x6dd5;
                local_a0 = 0;
                pcStack_98 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_90 = 0x65;
                LVar8.super_LineCol.col = 0;
                LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6dd5) << 0x40,0);
                LVar8.super_LineCol.line = SUB168(ZEXT816(0x6dd5) << 0x40,8);
                LVar8.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar8.name.len = 0x65;
                (*(this->m_stack).m_callbacks.m_error)
                          (local_168,0x37,LVar8,(this->m_stack).m_callbacks.m_user_data);
              }
              this->m_state->flags = this->m_state->flags & 0xfffffd1fU | 0x60;
              return true;
            }
          }
          goto LAB_001ce15f;
        }
        lVar10 = 0;
        do {
          lVar18 = lVar10;
          if (lVar18 == 1) break;
          lVar10 = lVar18 + 1;
        } while (local_178.str[lVar18 + 1] == "\": "[lVar18 + 2]);
        if (lVar18 == 0) goto LAB_001ce009;
LAB_001cdfd8:
        _start_seqimap(this);
LAB_001cdfe0:
        sVar14 = 2;
        goto LAB_001cdff7;
      }
LAB_001cdfe7:
      _start_seqimap(this);
    }
    else {
      if (*local_178.str != '[') {
        if ((local_178.len == 0) || (*local_178.str != '{')) goto LAB_001cdf8a;
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
        _push_level(this,true);
        _start_map(this,true);
        pSVar15 = this->m_state;
        uVar16 = pSVar15->flags & 0xffffff2fU | 0x50;
        goto LAB_001cdf86;
      }
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_seq(this,true);
      this->m_state->flags = this->m_state->flags | 0x10;
    }
  }
  else {
    if ((uVar16 >> 8 & 1) == 0) {
      bVar11 = is_debugger_attached();
      if ((bVar11) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar12 = (*pcVar1)();
        return (bool)uVar12;
      }
      pcVar17 = "ERROR: internal error";
      sVar14 = 0x15;
      goto LAB_001cdf29;
    }
    if ((1 < local_178.len) && (*local_178.str == ',')) {
      lVar10 = 0;
      do {
        lVar18 = lVar10;
        if (lVar18 == 1) break;
        lVar10 = lVar18 + 1;
      } while (local_178.str[lVar18 + 1] == " not within [0, "[lVar18 + 0xf]);
      if (lVar18 == 0) goto LAB_001cddd4;
      if ((this->m_state->flags & 0x10) == 0) {
        builtin_strncpy(local_168,"check failed: (has_all(FLOW))",0x1e);
        if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          uVar12 = (*pcVar1)();
          return (bool)uVar12;
        }
        local_d8 = 0;
        uStack_d0 = 0x6dfe;
        local_c8 = 0;
        pcStack_c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b8 = 0x65;
        LVar6.super_LineCol.col = 0;
        LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6dfe) << 0x40,0);
        LVar6.super_LineCol.line = SUB168(ZEXT816(0x6dfe) << 0x40,8);
        LVar6.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar6.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_168,0x1e,LVar6,(this->m_stack).m_callbacks.m_user_data);
      }
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x80;
      goto LAB_001cdfe0;
    }
LAB_001cddd4:
    if ((local_178.len == 0) || (*local_178.str != ',')) {
      iVar13 = basic_substring<const_char>::compare(&local_178,':');
      if (iVar13 != 0) {
        if ((1 < sVar14) && (*local_178.str == ':')) {
          lVar10 = 0;
          do {
            lVar18 = lVar10;
            if (lVar18 == 1) break;
            lVar10 = lVar18 + 1;
          } while (local_178.str[lVar18 + 1] == "\": "[lVar18 + 2]);
          if (lVar18 != 0) goto LAB_001cdfd8;
        }
        bVar11 = is_debugger_attached();
        if ((bVar11) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar1 = (code *)swi(3);
          uVar12 = (*pcVar1)();
          return (bool)uVar12;
        }
        pcVar17 = "ERROR: was expecting a comma";
        sVar14 = 0x1c;
LAB_001cdf29:
        fmt.len = sVar14;
        fmt.str = pcVar17;
        _err<>(this,fmt);
        return true;
      }
      goto LAB_001cdfe7;
    }
    if ((this->m_state->flags & 0x10) == 0) {
      builtin_strncpy(local_168,"check failed: (has_all(FLOW))",0x1e);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar12 = (*pcVar1)();
        return (bool)uVar12;
      }
      local_100 = 0;
      uStack_f8 = 0x6e06;
      local_f0 = 0;
      pcStack_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e0 = 0x65;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6e06) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x6e06) << 0x40,8);
      LVar7.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_168,0x1e,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    pSVar15 = this->m_state;
    uVar16 = pSVar15->flags & 0xfffffe7fU | 0x80;
LAB_001cdf86:
    pSVar15->flags = uVar16;
  }
LAB_001cdfef:
  sVar14 = 1;
LAB_001cdff7:
  _line_progressed(this,sVar14);
  return true;
}

Assistant:

bool Parser::_handle_seq_flow()
{
    _c4dbgpf("handle_seq_flow: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with(']'))
    {
        _c4dbgp("end the sequence");
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        bool is_quoted;
        if(_scan_scalar_seq_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL);
            _append_val(rem, is_quoted);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgpf("found '? ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(SSCL) && m_state->scalar == "");
            addrem_flags(QMRK|RKEY, RVAL|SSCL);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(", "))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('\t'))
        {
            _skipchars('\t');
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        if(rem.begins_with(", "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else
        {
            _c4err("was expecting a comma");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return true;
}